

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text-buffer.cc
# Opt level: O0

void __thiscall TextBuffer::set_text(TextBuffer *this,u16string *new_text)

{
  Range old_range;
  u16string local_48;
  Point local_28;
  Point local_20;
  u16string *local_18;
  u16string *new_text_local;
  TextBuffer *this_local;
  
  local_18 = new_text;
  new_text_local = (u16string *)this;
  Point::Point(&local_28,0,0);
  local_20 = extent(this);
  std::__cxx11::u16string::u16string((u16string *)&local_48,local_18);
  old_range.end = local_20;
  old_range.start = local_28;
  set_text_in_range(this,old_range,&local_48);
  std::__cxx11::u16string::~u16string((u16string *)&local_48);
  return;
}

Assistant:

void TextBuffer::set_text(const u16string &new_text) {
  set_text_in_range(Range{Point(0, 0), extent()}, u16string(new_text));
}